

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.c
# Opt level: O0

void ZSTD_DCtx_selectFrameDDict(ZSTD_DCtx *dctx)

{
  ZSTD_DDict *pZVar1;
  ZSTD_DDict *frameDDict;
  ZSTD_DCtx *dctx_local;
  
  if ((dctx->ddict != (ZSTD_DDict *)0x0) &&
     (pZVar1 = ZSTD_DDictHashSet_getDDict(dctx->ddictSet,(dctx->fParams).dictID),
     pZVar1 != (ZSTD_DDict *)0x0)) {
    ZSTD_clearDict(dctx);
    dctx->dictID = (dctx->fParams).dictID;
    dctx->ddict = pZVar1;
    dctx->dictUses = ZSTD_use_indefinitely;
  }
  return;
}

Assistant:

static void ZSTD_DCtx_selectFrameDDict(ZSTD_DCtx* dctx) {
    assert(dctx->refMultipleDDicts && dctx->ddictSet);
    DEBUGLOG(4, "Adjusting DDict based on requested dict ID from frame");
    if (dctx->ddict) {
        const ZSTD_DDict* frameDDict = ZSTD_DDictHashSet_getDDict(dctx->ddictSet, dctx->fParams.dictID);
        if (frameDDict) {
            DEBUGLOG(4, "DDict found!");
            ZSTD_clearDict(dctx);
            dctx->dictID = dctx->fParams.dictID;
            dctx->ddict = frameDDict;
            dctx->dictUses = ZSTD_use_indefinitely;
        }
    }
}